

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantTriangleSetCase::compare
          (InvariantTriangleSetCase *this,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsA,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsB,
          int param_3)

{
  _Rb_tree_header *p_Var1;
  ostringstream *poVar2;
  ulong uVar3;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *pvVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  Vector<tcu::Vector<float,_3>,_3> *b;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  allocator<char> local_299;
  TestLog *local_298;
  int local_28c;
  long local_288;
  long local_280;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *local_278;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *local_270;
  TriangleSet *local_268;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *local_260;
  TriangleSet trianglesA;
  string local_228 [32];
  TriangleSet trianglesB;
  Vector<float,_3> local_1d4;
  Vector<float,_3> local_1c8;
  Vector<float,_3> local_1bc;
  Triangle triangle;
  undefined1 local_18c [348];
  
  local_298 = ((this->super_PrimitiveSetInvarianceCase).super_TestCase.super_TestCase.super_TestNode
              .m_testCtx)->m_log;
  local_280 = (long)(coordsA->
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(coordsA->
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  local_288 = (long)(coordsB->
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(coordsB->
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &trianglesA._M_t._M_impl.super__Rb_tree_header._M_header;
  trianglesA._M_t._M_impl._0_1_ = 0;
  trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  trianglesA._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &trianglesB._M_t._M_impl.super__Rb_tree_header._M_header;
  trianglesB._M_t._M_impl._0_1_ = 0;
  trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  trianglesB._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar5 = 0;
  local_278 = coordsA;
  local_270 = coordsB;
  trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var6 = trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
        p_Var7 = trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left, iVar5 != 2) {
    lVar8 = local_288;
    local_260 = local_270;
    if (iVar5 == 0) {
      lVar8 = local_280;
      local_260 = local_278;
    }
    local_268 = &trianglesB;
    if (iVar5 == 0) {
      local_268 = &trianglesA;
    }
    uVar3 = (long)((ulong)(uint)((int)(lVar8 / 0xc) >> 0x1f) << 0x20 | lVar8 / 0xc & 0xffffffffU) /
            3;
    uVar9 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar9 = 0;
    }
    lVar8 = 0;
    local_28c = iVar5;
    while (pvVar4 = local_260, bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
      tcu::Vector<float,_3>::Vector
                (&local_1bc,
                 (local_260->
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start + (lVar8 >> 0x20));
      tcu::Vector<float,_3>::Vector
                (&local_1c8,
                 (pvVar4->
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start + (lVar8 + 0x100000000 >> 0x20));
      tcu::Vector<float,_3>::Vector
                (&local_1d4,
                 (pvVar4->
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start + (lVar8 + 0x200000000 >> 0x20));
      tcu::Vector<tcu::Vector<float,_3>,_3>::Vector(&triangle,&local_1bc,&local_1c8,&local_1d4);
      std::
      sort<tcu::Vector<float,3>*,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>>
                (&triangle,local_18c);
      std::
      set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
      ::insert(local_268,&triangle);
      lVar8 = lVar8 + 0x300000000;
    }
    iVar5 = local_28c + 1;
  }
  do {
    bVar11 = (_Rb_tree_header *)p_Var6 == &trianglesA._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &trianglesB._M_t._M_impl.super__Rb_tree_header;
    bVar12 = (_Rb_tree_header *)p_Var7 == p_Var1;
    bVar10 = bVar11 && bVar12;
    if (bVar10) {
LAB_01219941:
      std::
      set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
      ::~set(&trianglesB);
      std::
      set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
      ::~set(&trianglesA);
      return bVar10;
    }
    if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
       ((_Rb_tree_header *)p_Var6 == &trianglesA._M_t._M_impl.super__Rb_tree_header)) {
LAB_012197db:
      poVar2 = (ostringstream *)(triangle.m_data[0].m_data + 2);
      triangle.m_data[0].m_data._0_8_ = local_298;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                     );
      std::__cxx11::string::string<std::allocator<char>>
                (local_228,glcts::fixed_sample_locations_values + 1,&local_299);
      std::operator<<((ostream *)poVar2,local_228);
      std::operator<<((ostream *)poVar2,")");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      if ((bVar11) ||
         ((!bVar12 &&
          (bVar12 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                    ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                                  *)(p_Var6 + 1),(Vector<tcu::Vector<float,_3>,_3> *)(p_Var7 + 1),b)
          , !bVar12)))) {
        poVar2 = (ostringstream *)(triangle.m_data[0].m_data + 2);
        triangle.m_data[0].m_data._0_8_ = local_298;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"Note: e.g. triangle ");
        tcu::operator<<((ostream *)poVar2,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var7 + 1));
        std::operator<<((ostream *)poVar2," exists for second case but not for first");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        poVar2 = (ostringstream *)(triangle.m_data[0].m_data + 2);
        triangle.m_data[0].m_data._0_8_ = local_298;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"Note: e.g. triangle ");
        tcu::operator<<((ostream *)poVar2,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var6 + 1));
        std::operator<<((ostream *)poVar2," exists for first case but not for second");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(triangle.m_data[0].m_data + 2));
      goto LAB_01219941;
    }
    bVar12 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator!=
                       ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var6 + 1),
                        (Vector<tcu::Vector<float,_3>,_3> *)(p_Var7 + 1));
    if (bVar12) {
      bVar11 = false;
      bVar12 = false;
      goto LAB_012197db;
    }
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

virtual bool compare (const vector<Vec3>& coordsA, const vector<Vec3>& coordsB, int) const
	{
		return compareTriangleSets(coordsA, coordsB, m_testCtx.getLog());
	}